

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHandlerCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_300519::SaveRestoreErrorState::~SaveRestoreErrorState
          (SaveRestoreErrorState *this)

{
  bool bVar1;
  bool currentState;
  SaveRestoreErrorState *this_local;
  
  if ((this->CaptureCMakeErrorValue & 1U) == 0) {
    if ((this->InitialErrorState & 1U) != 0) {
      cmSystemTools::SetErrorOccurred();
    }
  }
  else {
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    if (bVar1 != (bool)(this->InitialErrorState & 1U)) {
      if ((this->InitialErrorState & 1U) == 0) {
        cmSystemTools::ResetErrorOccurredFlag();
      }
      else {
        cmSystemTools::SetErrorOccurred();
      }
    }
  }
  return;
}

Assistant:

~SaveRestoreErrorState()
  {
    // if we are not saving the return value then make sure
    // if it was in error it goes back to being in error
    // otherwise leave it be what it is
    if (!this->CaptureCMakeErrorValue) {
      if (this->InitialErrorState) {
        cmSystemTools::SetErrorOccurred();
      }
      return;
    }
    // if we have saved the error in a return variable
    // then put things back exactly like they were
    bool currentState = cmSystemTools::GetErrorOccurredFlag();
    // if the state changed during this command we need
    // to handle it, if not then nothing needs to be done
    if (currentState != this->InitialErrorState) {
      // restore the initial error state
      if (this->InitialErrorState) {
        cmSystemTools::SetErrorOccurred();
      } else {
        cmSystemTools::ResetErrorOccurredFlag();
      }
    }
  }